

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O3

void __thiscall slang::ast::ClockingSkew::serializeTo(ClockingSkew *this,ASTSerializer *serializer)

{
  size_t __n;
  
  if ((long)(int)this->edge != 0) {
    __n = strlen(*(char **)(toString(slang::ast::EdgeKind)::strings + (long)(int)this->edge * 8));
    ASTSerializer::write(serializer,4,"edge",__n);
  }
  if (this->delay != (TimingControl *)0x0) {
    ASTSerializer::write(serializer,5,"delay",(size_t)this->delay);
    return;
  }
  return;
}

Assistant:

void ClockingSkew::serializeTo(ASTSerializer& serializer) const {
    if (edge != EdgeKind::None)
        serializer.write("edge", toString(edge));
    if (delay)
        serializer.write("delay", *delay);
}